

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::BeginFunctionBody
          (BinaryReaderInterp *this,Index index,Offset size)

{
  _Rb_tree_header *p_Var1;
  pointer pFVar2;
  pointer pLVar3;
  Offset OVar4;
  Result RVar5;
  Location loc;
  Location local_38;
  
  pFVar2 = (this->module_->funcs).
           super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  this->func_ = pFVar2 + (index - ((int)((ulong)((long)(this->func_types_).
                                                                                                              
                                                  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(this->func_types_).
                                                                                                            
                                                  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 6) +
                                  (int)((ulong)((long)(this->module_->funcs).
                                                                                                            
                                                  super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)pFVar2) >> 3) * 0x11111111));
  OVar4 = Istream::end(this->istream_);
  this->func_->code_offset = OVar4;
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::_M_erase((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)&this->depth_fixups_,
             (_Link_type)
             (this->depth_fixups_).map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  p_Var1 = &(this->depth_fixups_).map._M_t._M_impl.super__Rb_tree_header;
  (this->depth_fixups_).map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->depth_fixups_).map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->depth_fixups_).map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->depth_fixups_).map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pLVar3 = (this->label_stack_).
           super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->label_stack_).
      super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
      ._M_impl.super__Vector_impl_data._M_finish != pLVar3) {
    (this->label_stack_).
    super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar3;
  }
  FixupMap::Resolve(&this->func_fixups_,this->istream_,index);
  local_38.field_1.field_0.last_column = 0;
  local_38.filename._M_len = (this->filename_)._M_len;
  local_38.filename._M_str = (this->filename_)._M_str;
  local_38.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar5 = SharedValidator::BeginFunctionBody(&this->validator_,&local_38,index);
  if (RVar5.enum_ != Error) {
    PushLabel(this,Try,0xffffffff,0xffffffff,
              (int)((ulong)((long)(this->func_->handlers).
                                  super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->func_->handlers).
                                 super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249);
  }
  return (Result)(uint)(RVar5.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::BeginFunctionBody(Index index, Offset size) {
  Index defined_index = index - num_func_imports();
  func_ = &module_.funcs[defined_index];
  func_->code_offset = istream_.end();

  depth_fixups_.Clear();
  label_stack_.clear();

  // The fixups map is keyed by actual function index (not defined_index)
  // (function imports don't have code and won't appear in the fixups map,
  // but they still use function indexes)
  func_fixups_.Resolve(istream_, index);

  CHECK_RESULT(validator_.BeginFunctionBody(GetLocation(), index));

  // Push implicit func label (equivalent to return).
  // With exception handling it acts as a catch-less try block, which is
  // needed to support delegating to the caller of a function using the
  // try-delegate instruction.
  PushLabel(LabelKind::Try, Istream::kInvalidOffset, Istream::kInvalidOffset,
            func_->handlers.size());
  return Result::Ok;
}